

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkHaigCollectMembers(Hop_Man_t *p)

{
  long *plVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Hop_Obj_t *pHVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 0x1002;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(0x8010);
  pVVar2->pArray = ppvVar3;
  pHVar4 = (Hop_Obj_t *)p->vObjs;
  if (0 < *(int *)((long)&pHVar4->field_0 + 4)) {
    iVar8 = 0;
    uVar7 = 0x1002;
    lVar9 = 0;
    do {
      plVar1 = (long *)(&((pHVar4->field_1).pNext)->field_0)[lVar9].pData;
      if (*plVar1 != 0) {
        pHVar4 = Hop_ObjRepr(pHVar4);
        *plVar1 = (long)pHVar4;
        iVar6 = (int)uVar7;
        if (iVar8 == iVar6) {
          if (iVar6 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar7 = 0x10;
          }
          else {
            uVar7 = (ulong)(uint)(iVar6 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar7 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar7 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar6 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar5 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar2->nSize = iVar8;
        ppvVar3[lVar5] = plVar1;
        pHVar4 = (Hop_Obj_t *)p->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)((long)&pHVar4->field_0 + 4));
  }
  return pVVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Collects the nodes in the classes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Abc_NtkHaigCollectMembers( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pObj;
    int i;
    vObjs = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pObj->pData = Hop_ObjRepr( pObj );
        Vec_PtrPush( vObjs, pObj );
    }
    return vObjs;
}